

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall
SolverTest_OutputHandler_Test::~SolverTest_OutputHandler_Test(SolverTest_OutputHandler_Test *this)

{
  void *in_RDI;
  
  ~SolverTest_OutputHandler_Test((SolverTest_OutputHandler_Test *)0x164378);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SolverTest, OutputHandler) {
  struct TestOutputHandler : mp::OutputHandler {
    std::string output;

    virtual ~TestOutputHandler() {}
    void HandleOutput(fmt::CStringRef output) {
      this->output += output.c_str();
    }
  };

  TestOutputHandler oh;
  TestSolver s("test");
  s.set_output_handler(&oh);
  EXPECT_TRUE(&oh == s.output_handler());
  s.Print("line {}\n", 1);
  s.Print("line {}\n", 2);
  EXPECT_EQ("line 1\nline 2\n", oh.output);
}